

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t
bsc_bcast_2tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_step_t bVar1;
  long lVar2;
  
  bVar1 = depends;
  if (0 < n) {
    lVar2 = 0;
    do {
      bVar1 = bsc_bcast_qtree_single
                        (depends,root,group,*(void **)((long)&params->src + lVar2),
                         *(void **)((long)&params->dst + lVar2),
                         *(bsc_size_t *)((long)&params->size + lVar2),2);
      lVar2 = lVar2 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar2);
  }
  return bVar1;
}

Assistant:

bsc_step_t bsc_bcast_2tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_bcast_qtree_single( depends, root, group,
                params[i].src, params[i].dst, params[i].size, 2 );
    }

    return finished;
}